

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_3,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (binary<tcu::Matrix<double,_3,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  undefined8 *puVar3;
  int row_1;
  undefined8 *puVar4;
  GLdouble *data;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined8 uVar12;
  Matrix<double,_3,_3> result;
  undefined8 local_f8 [10];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_68 [72];
  long lVar10;
  
  puVar4 = local_f8;
  puVar3 = local_f8;
  lVar7 = 0;
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_f8[6] = 0;
  local_f8[7] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[8] = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    auVar9 = _DAT_019fcc00;
    do {
      bVar11 = SUB164(auVar9 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
               SUB164(auVar9 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar7 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)puVar4 + lVar6) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar7 + -0x18 != lVar6) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)puVar4 + lVar6 + 0x18) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0x60);
    lVar5 = lVar5 + 1;
    lVar7 = lVar7 + 0x18;
    puVar4 = (undefined8 *)((long)puVar4 + 8);
  } while (lVar5 != 3);
  local_78 = *(undefined8 *)((long)argument_src + 0x10);
  local_88 = *argument_src;
  uStack_80 = *(undefined8 *)((long)argument_src + 8);
  puVar4 = (undefined8 *)((long)argument_src + (ulong)GVar2);
  local_a8 = *puVar4;
  uStack_a0 = puVar4[1];
  local_98 = *(undefined8 *)((long)argument_src + (ulong)GVar2 + 0x10);
  puVar8 = local_68;
  (*pcVar1)(puVar8);
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar7) = *(undefined8 *)(puVar8 + lVar7);
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    lVar5 = lVar5 + 1;
    puVar3 = (undefined8 *)((long)puVar3 + 8);
    puVar8 = puVar8 + 8;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)result_dst + lVar5 + 0x10) =
         *(undefined8 *)((long)local_f8 + lVar5 + 0x10);
    uVar12 = *(undefined8 *)((long)local_f8 + lVar5 + 8);
    *(undefined8 *)((long)result_dst + lVar5) = *(undefined8 *)((long)local_f8 + lVar5);
    ((undefined8 *)((long)result_dst + lVar5))[1] = uVar12;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}